

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O3

int __thiscall sc_core::sc_phash_base::insert(sc_phash_base *this,void *k,void *c)

{
  uint uVar1;
  sc_phash_elem *psVar2;
  
  uVar1 = (*this->hash)(k);
  uVar1 = uVar1 % (uint)this->num_bins;
  psVar2 = find_entry(this,uVar1,k,(sc_phash_elem ***)0x0);
  if (psVar2 == (sc_phash_elem *)0x0) {
    add_direct(this,k,c,uVar1);
  }
  else {
    psVar2->contents = c;
  }
  return (uint)(psVar2 != (sc_phash_elem *)0x0);
}

Assistant:

int
sc_phash_base::insert( void* k, void* c )
{
    unsigned hash_val = do_hash(k);
    sc_phash_elem* ptr = find_entry( hash_val, k );
    if (ptr == 0) {
        (void) add_direct(k, c, hash_val);
        return 0;
    }
    else {
        ptr->contents = c;
        return 1;
    }
}